

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,shared_ptr<helics::Broker> *brk)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 extraout_var;
  
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *(undefined4 *)
           &(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 4)
  ;
  uVar4 = *(undefined4 *)
           &(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                   ._M_pi + 4);
  (brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
       = uVar3;
  *(undefined4 *)
   &(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = uVar4;
  *(undefined4 *)
   ((long)&(this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi + 4) = uVar5;
  (brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  peVar1 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar6 = (*peVar1->_vptr_Broker[0xb])();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar6));
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(std::shared_ptr<Broker> brk): broker(std::move(brk))
{
    if (broker) {
        name = broker->getIdentifier();
    }
}